

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::
GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test::TestBody
          (GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test *this)

{
  TestConflictingSymbolNames_BadKnownNamesValues TStack_38;
  
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  TestConflictingSymbolNames_BadKnownNamesFields
            ((TestConflictingSymbolNames_BadKnownNamesFields *)&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  ~TestConflictingSymbolNames_BadKnownNamesFields
            ((TestConflictingSymbolNames_BadKnownNamesFields *)&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
            (&TStack_38,
             (ExtensionIdentifier<proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::swap_);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestSwapNameIsNotMangledForFields) {
  // For backwards compatibility we do not mangle `swap`. It works thanks to
  // overload resolution.
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesFields().swap();

  // But we do mangle `swap` for extensions because there is no overloading
  // there.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::swap_);
}